

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O2

void __thiscall
google::protobuf::DescriptorBuilder::AddWarning
          (DescriptorBuilder *this,string_view element_name,Message *descriptor,
          ErrorLocation location,
          FunctionRef<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>
          make_error)

{
  ErrorCollector *pEVar1;
  undefined4 uVar2;
  size_type sVar3;
  undefined4 uVar4;
  pointer pcVar5;
  LogMessage *pLVar6;
  string error;
  LogMessage local_68;
  size_type local_58;
  pointer pcStack_50;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  
  (*make_error.invoker_)(&local_48,make_error.ptr_);
  pEVar1 = this->error_collector_;
  if (pEVar1 == (ErrorCollector *)0x0) {
    absl::lts_20250127::log_internal::LogMessage::LogMessage
              (&local_68,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor.cc"
               ,0x1487);
    pLVar6 = absl::lts_20250127::log_internal::LogMessage::operator<<(&local_68,&this->filename_);
    pLVar6 = absl::lts_20250127::log_internal::LogMessage::operator<<(pLVar6,(char (*) [2])0xf00a48)
    ;
    pLVar6 = absl::lts_20250127::log_internal::LogMessage::operator<<(pLVar6,element_name);
    pLVar6 = absl::lts_20250127::log_internal::LogMessage::operator<<
                       (pLVar6,(char (*) [3])0x10f1c82);
    absl::lts_20250127::log_internal::LogMessage::operator<<(pLVar6,&local_48);
    absl::lts_20250127::log_internal::LogMessage::~LogMessage(&local_68);
  }
  else {
    local_58 = local_48._M_string_length;
    sVar3 = local_58;
    pcStack_50 = local_48._M_dataplus._M_p;
    pcVar5 = pcStack_50;
    local_58._0_4_ = (undefined4)local_48._M_string_length;
    uVar2 = (undefined4)local_58;
    pcStack_50._0_4_ = SUB84(local_48._M_dataplus._M_p,0);
    uVar4 = pcStack_50._0_4_;
    local_58 = sVar3;
    pcStack_50 = pcVar5;
    (*pEVar1->_vptr_ErrorCollector[3])
              (pEVar1,(this->filename_)._M_string_length,(this->filename_)._M_dataplus._M_p,
               element_name._M_len,element_name._M_str,descriptor,location,uVar2,uVar4);
  }
  std::__cxx11::string::~string((string *)&local_48);
  return;
}

Assistant:

PROTOBUF_NOINLINE void DescriptorBuilder::AddWarning(
    const absl::string_view element_name, const Message& descriptor,
    DescriptorPool::ErrorCollector::ErrorLocation location,
    absl::FunctionRef<std::string()> make_error) {
  std::string error = make_error();
  if (error_collector_ == nullptr) {
    ABSL_LOG(WARNING) << filename_ << " " << element_name << ": " << error;
  } else {
    error_collector_->RecordWarning(filename_, element_name, &descriptor,
                                    location, error);
  }
}